

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

Matrix4x4 * __thiscall CGL::Matrix4x4::operator*(Matrix4x4 *this,Matrix4x4 *B)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  anon_union_32_3_e2189aaa_for_Vector4D_0 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  Matrix4x4 *C;
  anon_union_32_3_e2189aaa_for_Vector4D_0 *in_RDI;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  
  auVar13 = ZEXT816(0) << 0x40;
  in_RDI[3] = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar13);
  in_RDI[2] = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar13);
  in_RDI[1] = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar13);
  *in_RDI = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar13);
  aVar6 = B->entries[0].field_0;
  auVar9 = vperm2f128_avx((undefined1  [32])aVar6,(undefined1  [32])B->entries[2].field_0,0x20);
  auVar10 = vperm2f128_avx((undefined1  [32])B->entries[1].field_0,
                           (undefined1  [32])B->entries[3].field_0,0x20);
  auVar14 = vperm2f128_avx((undefined1  [32])aVar6,(undefined1  [32])B->entries[2].field_0,0x31);
  auVar11 = vperm2f128_avx((undefined1  [32])B->entries[1].field_0,
                           (undefined1  [32])B->entries[3].field_0,0x31);
  auVar7 = vunpcklpd_avx(auVar9,auVar10);
  auVar8 = vunpcklpd_avx(auVar14,auVar11);
  auVar9 = vunpckhpd_avx(auVar9,auVar10);
  auVar10 = vunpckhpd_avx(auVar14,auVar11);
  lVar12 = 0;
  do {
    dVar1 = *(double *)((long)&this->entries[0].field_0 + lVar12 * 4 + 8);
    dVar2 = *(double *)((long)&this->entries[0].field_0 + lVar12 * 4);
    dVar3 = *(double *)((long)&this->entries[0].field_0 + lVar12 * 4 + 0x10);
    dVar4 = *(double *)((long)&this->entries[0].field_0 + lVar12 * 4 + 0x18);
    auVar13._0_8_ =
         dVar4 * auVar10._0_8_ + dVar3 * auVar8._0_8_ + dVar2 * auVar7._0_8_ + auVar9._0_8_ * dVar1;
    auVar13._8_8_ =
         dVar4 * auVar10._8_8_ + dVar3 * auVar8._8_8_ + dVar2 * auVar7._8_8_ + auVar9._8_8_ * dVar1;
    auVar14._16_8_ =
         dVar4 * auVar10._16_8_ +
         dVar3 * auVar8._16_8_ + dVar2 * auVar7._16_8_ + auVar9._16_8_ * dVar1;
    auVar14._0_16_ = auVar13;
    auVar14._24_8_ =
         dVar4 * auVar10._24_8_ +
         dVar3 * auVar8._24_8_ + dVar2 * auVar7._24_8_ + auVar9._24_8_ * dVar1;
    uVar5 = vmovlpd_avx(auVar13);
    *(undefined8 *)((long)in_RDI + lVar12) = uVar5;
    uVar5 = vmovhpd_avx(auVar13);
    *(undefined8 *)((long)in_RDI + lVar12 + 0x20) = uVar5;
    uVar5 = vmovlpd_avx(auVar14._16_16_);
    *(undefined8 *)((long)in_RDI + lVar12 + 0x40) = uVar5;
    uVar5 = vmovhpd_avx(auVar14._16_16_);
    *(undefined8 *)((long)in_RDI + lVar12 + 0x60) = uVar5;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x20);
  return (Matrix4x4 *)in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::operator*(const Matrix4x4 &B) const {
  const Matrix4x4 &A(*this);
  Matrix4x4 C;

  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
#ifdef __AVX__
      C(i, j) = dot(A[i], Vector4D(B(0, j), B(1, j), B(2, j), B(3, j)));
#else
      C(i, j) = 0.;

      for (int k = 0; k < 4; k++) {
        C(i, j) += A(i, k) * B(k, j);
      }
#endif
    }
  }

  return C;
}